

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O0

void __thiscall
TPZDohrPrecond<float,_TPZDohrSubstructCondense<float>_>::ComputeV1
          (TPZDohrPrecond<float,_TPZDohrSubstructCondense<float>_> *this,TPZFMatrix<float> *x,
          TPZFMatrix<float> *v1)

{
  _func_int **pp_Var1;
  bool bVar2;
  TPZFMatrix<float> *global;
  TPZDohrSubstructCondense<float> *this_00;
  reference pTVar3;
  TPZDohrSubstructCondense<float> *v1_local_00;
  TPZBaseMatrix *in_RSI;
  TPZFMatrix<float> *in_RDI;
  TPZFMatrix<float> CoarseSolution_local;
  TPZFMatrix<float> v1_local;
  TPZFMatrix<float> CoarseSolution;
  TPZFMatrix<float> CoarseResidual_local;
  TPZFMatrix<float> xloc;
  int isub;
  const_iterator it;
  TPZFMatrix<float> CoarseResidual;
  undefined4 in_stack_fffffffffffffbd8;
  DecomposeType in_stack_fffffffffffffbdc;
  TPZDohrSubstructCondense<float> *in_stack_fffffffffffffbe0;
  TPZFMatrix<float> *in_stack_fffffffffffffbf8;
  TPZFMatrix<float> *local;
  TPZFMatrix<float> *in_stack_fffffffffffffc00;
  TPZDohrAssembly<float> *in_stack_fffffffffffffc08;
  int isub_00;
  TPZDohrSubstructCondense<float> *in_stack_fffffffffffffc10;
  TPZDohrAssembly<float> *in_stack_fffffffffffffc18;
  _Self local_2a0;
  _List_node_base *local_298;
  undefined1 local_290 [144];
  _List_node_base *local_200;
  _Self local_d8;
  _List_node_base *local_d0;
  int local_c4;
  _List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_> local_c0 [3];
  undefined1 local_a8 [152];
  TPZBaseMatrix *local_10;
  
  local_10 = in_RSI;
  TPZBaseMatrix::Cols(in_RSI);
  TPZFMatrix<float>::TPZFMatrix
            (in_RDI,(int64_t)in_stack_fffffffffffffc18,(int64_t)in_stack_fffffffffffffc10);
  TPZFMatrix<float>::Zero((TPZFMatrix<float> *)in_stack_fffffffffffffbe0);
  std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>::_List_const_iterator
            (local_c0);
  local_c4 = 0;
  local_d0 = (_List_node_base *)
             std::__cxx11::
             list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
             ::begin((list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  local_c0[0]._M_node = local_d0;
  while( true ) {
    local_d8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
         ::end((list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    bVar2 = std::operator!=(local_c0,&local_d8);
    isub_00 = (int)((ulong)in_stack_fffffffffffffc08 >> 0x20);
    if (!bVar2) break;
    TPZFMatrix<float>::TPZFMatrix((TPZFMatrix<float> *)in_stack_fffffffffffffc10);
    TPZFMatrix<float>::TPZFMatrix((TPZFMatrix<float> *)in_stack_fffffffffffffc10);
    in_stack_fffffffffffffc18 =
         TPZAutoPointer<TPZDohrAssembly<float>_>::operator->
                   ((TPZAutoPointer<TPZDohrAssembly<float>_> *)
                    &(in_RDI->fPivot).super_TPZVec<int>.fNAlloc);
    TPZDohrAssembly<float>::Extract
              ((TPZDohrAssembly<float> *)in_stack_fffffffffffffc10,isub_00,in_stack_fffffffffffffc00
               ,in_stack_fffffffffffffbf8);
    pTVar3 = std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>::operator*
                       ((_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_> *)
                        in_stack_fffffffffffffbe0);
    in_stack_fffffffffffffc10 = TPZAutoPointer<TPZDohrSubstructCondense<float>_>::operator->(pTVar3)
    ;
    TPZDohrSubstructCondense<float>::Contribute_rc_local
              (in_stack_fffffffffffffbe0,
               (TPZFMatrix<float> *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
               (TPZFMatrix<float> *)0x1f7dbd6);
    in_stack_fffffffffffffc08 =
         TPZAutoPointer<TPZDohrAssembly<float>_>::operator->
                   ((TPZAutoPointer<TPZDohrAssembly<float>_> *)
                    &(in_RDI->fPivot).super_TPZVec<int>.fNAlloc);
    TPZDohrAssembly<float>::AssembleCoarse
              ((TPZDohrAssembly<float> *)in_stack_fffffffffffffc10,
               (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
               in_stack_fffffffffffffbf8);
    TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x1f7dc1d);
    TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x1f7dc2a);
    local_200 = (_List_node_base *)
                std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>::
                operator++(local_c0,0);
    local_c4 = local_c4 + 1;
  }
  TPZStepSolver<float>::SetDirect
            ((TPZStepSolver<float> *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
  local = (TPZFMatrix<float> *)(in_RDI->fPivot).super_TPZVec<int>.fStore;
  global = (TPZFMatrix<float> *)TPZBaseMatrix::Cols(local_10);
  TPZFMatrix<float>::TPZFMatrix
            (in_RDI,(int64_t)in_stack_fffffffffffffc18,(int64_t)in_stack_fffffffffffffc10);
  pp_Var1 = (in_RDI->fPivot).super_TPZVec<int>._vptr_TPZVec;
  (**(code **)(*pp_Var1 + 0x58))(pp_Var1,local_a8,local_290,0);
  local_c4 = 0;
  local_298 = (_List_node_base *)
              std::__cxx11::
              list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
              ::begin((list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  local_c0[0]._M_node = local_298;
  while( true ) {
    local_2a0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
         ::end((list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    bVar2 = std::operator!=(local_c0,&local_2a0);
    if (!bVar2) break;
    TPZFMatrix<float>::TPZFMatrix((TPZFMatrix<float> *)in_stack_fffffffffffffc10);
    TPZFMatrix<float>::TPZFMatrix((TPZFMatrix<float> *)in_stack_fffffffffffffc10);
    this_00 = (TPZDohrSubstructCondense<float> *)
              TPZAutoPointer<TPZDohrAssembly<float>_>::operator->
                        ((TPZAutoPointer<TPZDohrAssembly<float>_> *)
                         &(in_RDI->fPivot).super_TPZVec<int>.fNAlloc);
    TPZDohrAssembly<float>::ExtractCoarse
              ((TPZDohrAssembly<float> *)in_stack_fffffffffffffc10,
               (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),global,local);
    pTVar3 = std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>::operator*
                       ((_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_> *)
                        in_stack_fffffffffffffbe0);
    v1_local_00 = TPZAutoPointer<TPZDohrSubstructCondense<float>_>::operator->(pTVar3);
    TPZDohrSubstructCondense<float>::Contribute_v1_local
              (this_00,(TPZFMatrix<float> *)v1_local_00,
               (TPZFMatrix<float> *)in_stack_fffffffffffffbe0);
    in_stack_fffffffffffffbe0 =
         (TPZDohrSubstructCondense<float> *)
         TPZAutoPointer<TPZDohrAssembly<float>_>::operator->
                   ((TPZAutoPointer<TPZDohrAssembly<float>_> *)
                    &(in_RDI->fPivot).super_TPZVec<int>.fNAlloc);
    TPZDohrAssembly<float>::Assemble
              ((TPZDohrAssembly<float> *)in_stack_fffffffffffffc10,
               (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),global,local);
    TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x1f7de5b);
    TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x1f7de68);
    std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>::operator++
              (local_c0,0);
    local_c4 = local_c4 + 1;
  }
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x1f7def8);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x1f7df05);
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::ComputeV1(const TPZFMatrix<TVar> &x, TPZFMatrix<TVar> &v1) const
{
	/* Computing r(c) */
	TPZFMatrix<TVar> CoarseResidual(fNumCoarse,x.Cols());
	CoarseResidual.Zero();
	typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator it;
	
	int isub = 0;
	for(it= fGlobal.begin(); it != fGlobal.end(); it++, isub++) {
		TPZFMatrix<TVar> xloc, CoarseResidual_local;
		fAssemble->Extract(isub,x,xloc);
		//		(*it)->LoadWeightedResidual(xloc);
		(*it)->Contribute_rc_local(xloc,CoarseResidual_local);
		fAssemble->AssembleCoarse(isub,CoarseResidual_local,CoarseResidual);
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		CoarseResidual.Print("Coarse Residual",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
	/* Computing K(c)_inverted*r(c) and stores it in "product" */
	fCoarse->SetDirect(ELDLt);
	//Dado global
	TPZFMatrix<TVar> CoarseSolution(fNumCoarse,x.Cols());
	fCoarse->Solve(CoarseResidual,CoarseSolution);
#ifdef PZ_LOG
	{
		std::stringstream sout;
		CoarseSolution.Print("CoarseSolution",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
	isub=0;
	//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
	{
		// Gerenciamento Global->Local sobre o product
		//product é administrado pelo DM mas permanece no processador 0
		// tarefa separada, expansao da solucao coarse
		TPZFMatrix<TVar> v1_local,CoarseSolution_local;
		fAssemble->ExtractCoarse(isub,CoarseSolution,CoarseSolution_local);
		(*it)->Contribute_v1_local(v1_local,CoarseSolution_local);
		
		fAssemble->Assemble(isub,v1_local,v1);
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		v1.Print("v1 vector",sout);
		if (loggerv1v2.isDebugEnabled())
		{
			LOGPZ_DEBUG(loggerv1v2, sout.str())
		}
	}
#endif
}